

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

double Js::JavascriptMath::Random(ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  uint64 uVar2;
  ScriptContext *in_RDX;
  ulong uVar3;
  double dVar4;
  uint64 local_30;
  uint64 seed0;
  uint64 seed1;
  
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  if (pJVar1->isPRNGSeeded == false) {
    InitializeRandomSeeds(&local_30,&seed0,in_RDX);
    Output::Trace(PRNGPhase,L"[PRNG:%x] INIT %I64x %I64x\n",scriptContext,local_30,seed0);
    JavascriptLibrary::SetIsPRNGSeeded
              ((scriptContext->super_ScriptContextBase).javascriptLibrary,true);
    if (scriptContext->TTDShouldPerformReplayAction == true) {
      TTD::EventLog::ReplayExternalEntropyRandomEvent
                (scriptContext->threadContext->TTDLog,&local_30,&seed0);
    }
    else if (scriptContext->TTDShouldPerformRecordAction == true) {
      TTD::EventLog::RecordExternalEntropyRandomEvent
                (scriptContext->threadContext->TTDLog,local_30,seed0);
    }
  }
  else {
    local_30 = pJVar1->randSeed0;
    seed0 = pJVar1->randSeed1;
  }
  Output::Trace(PRNGPhase,L"[PRNG:%x] SEED %I64x %I64x\n",scriptContext,local_30,seed0);
  uVar2 = local_30;
  local_30 = seed0;
  uVar3 = uVar2 << 0x17 ^ uVar2;
  uVar3 = uVar3 >> 0x11 ^ seed0 >> 0x1a ^ seed0 ^ uVar3;
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pJVar1->randSeed0 = seed0;
  pJVar1->randSeed1 = uVar3;
  dVar4 = (double)(uVar3 + seed0 & 0xfffffffffffff | 0x3ff0000000000000) + -1.0;
  seed0 = uVar3;
  Output::Trace(PRNGPhase,L"[PRNG:%x] RAND %I64x\n",scriptContext,dVar4);
  return dVar4;
}

Assistant:

double JavascriptMath::Random(ScriptContext *scriptContext)
        {
            JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(DirectMath_Random);
            uint64 seed0;
            uint64 seed1;

            if (!scriptContext->GetLibrary()->IsPRNGSeeded())
            {
                InitializeRandomSeeds(&seed0, &seed1, scriptContext);
#if DBG_DUMP
                OUTPUT_TRACE(Js::PRNGPhase, _u("[PRNG:%x] INIT %I64x %I64x\n"), scriptContext, seed0, seed1);
#endif
                scriptContext->GetLibrary()->SetIsPRNGSeeded(true);

#if ENABLE_TTD
                if(scriptContext->ShouldPerformReplayAction())
                {
                    scriptContext->GetThreadContext()->TTDLog->ReplayExternalEntropyRandomEvent(&seed0, &seed1);
                }
                else if(scriptContext->ShouldPerformRecordAction())
                {
                    scriptContext->GetThreadContext()->TTDLog->RecordExternalEntropyRandomEvent(seed0, seed1);
                }
                else
                {
                    ;
                }
#endif
            }
            else
            {
                seed0 = scriptContext->GetLibrary()->GetRandSeed0();
                seed1 = scriptContext->GetLibrary()->GetRandSeed1();
            }

#if DBG_DUMP
            OUTPUT_TRACE(Js::PRNGPhase, _u("[PRNG:%x] SEED %I64x %I64x\n"), scriptContext, seed0, seed1);
#endif

            Xorshift128plus(&seed0, &seed1);

            //update the seeds in script context
            scriptContext->GetLibrary()->SetRandSeed0(seed0);
            scriptContext->GetLibrary()->SetRandSeed1(seed1);

            double res = ConvertRandomSeedsToDouble(seed0, seed1);
#if DBG_DUMP
            OUTPUT_TRACE(Js::PRNGPhase, _u("[PRNG:%x] RAND %I64x\n"), scriptContext, *((uint64 *)&res));
#endif
            return res;
            JIT_HELPER_END(DirectMath_Random);
        }